

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniserver.c
# Opt level: O3

void handle_request(void *args)

{
  uint sockfd;
  size_t sVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  http_header_t *phVar5;
  size_t sVar6;
  char *pcVar7;
  MiniServerCallback p_Var8;
  size_t sVar9;
  void *pvVar10;
  char *pcVar11;
  int timeout;
  socklen_t addr_len;
  memptr header;
  SOCKINFO info;
  char host_port [256];
  membuffer redir_buf;
  char redir_str [256];
  http_parser_t parser;
  int local_564;
  MiniServerCallback local_560;
  WebCallback_HostValidate local_558;
  int local_54c [3];
  memptr local_540;
  SOCKINFO local_530;
  char local_4a8 [256];
  membuffer local_3a8 [4];
  char local_328 [264];
  http_parser_t local_220;
  
  local_54c[0] = 0x1e;
  sockfd = *args;
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x195,
             "miniserver %d: READING\n",(ulong)sockfd);
  iVar3 = sock_init_with_ip(&local_530,sockfd,(sockaddr *)((long)args + 8));
  if (iVar3 != 0) {
    free(args);
    httpmsg_destroy(&local_220.msg);
    return;
  }
  iVar3 = http_RecvMessage(&local_530,&local_220,HTTPMETHOD_UNKNOWN,local_54c,&local_564);
  if (iVar3 != 0) goto LAB_0010b6c7;
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1aa,
             "miniserver %d: PROCESSING...\n",(ulong)sockfd);
  p_Var8 = gGetCallback;
  pvVar10 = gWebCallback_HostValidateCookie;
  local_564 = 500;
  if (HTTPMETHOD_SIMPLEGET < local_220.msg.method) goto LAB_0010b6c7;
  if ((0x101cU >> (local_220.msg.method & 0x1f) & 1) == 0) {
    if ((0x1c0U >> (local_220.msg.method & 0x1f) & 1) == 0) {
      if ((0x820U >> (local_220.msg.method & 0x1f) & 1) == 0) goto LAB_0010b6c7;
      pcVar7 = "miniserver %d: got SOAP msg\n";
      iVar3 = 0xfe;
      p_Var8 = gSoapCallback;
    }
    else {
      pcVar7 = "miniserver %d: got GENA msg\n";
      iVar3 = 0x10a;
      p_Var8 = gGenaCallback;
    }
    local_558 = (WebCallback_HostValidate)0x0;
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",iVar3,pcVar7,
               (ulong)(uint)local_530.socket);
    pvVar10 = (void *)0x0;
  }
  else {
    local_558 = gWebCallback_HostValidate;
    UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x119,
               "miniserver %d: got WEB server msg\n",(ulong)(uint)local_530.socket);
  }
  if (p_Var8 == (MiniServerCallback)0x0) goto LAB_0010b6c7;
  phVar5 = httpmsg_find_hdr(&local_220.msg,7,&local_540);
  local_564 = -0x77;
  if (phVar5 == (http_header_t *)0x0) goto LAB_0010b6c7;
  sVar6 = 0xff;
  if (local_540.length < 0xff) {
    sVar6 = local_540.length;
  }
  pcVar7 = local_4a8;
  local_560 = p_Var8;
  memcpy(pcVar7,local_540.buf,sVar6);
  local_4a8[sVar6] = '\0';
  if (local_558 == (WebCallback_HostValidate)0x0) {
    sVar1 = sVar6;
    do {
      sVar9 = sVar1;
      cVar2 = local_4a8[0];
      if (sVar9 == 1) goto LAB_0010b676;
      cVar2 = local_530.foreign_sockaddr.__ss_padding[sVar9 + 0x7d];
    } while ((cVar2 != ':') && (sVar1 = sVar9 - 1, cVar2 != ']'));
    pcVar7 = local_530.foreign_sockaddr.__ss_padding + sVar9 + 0x7d;
LAB_0010b676:
    pcVar11 = local_4a8 + sVar6;
    if (cVar2 == ':') {
      *pcVar7 = '\0';
      pcVar11 = pcVar7;
    }
    iVar3 = inet_pton(2,local_4a8,local_328);
    if (iVar3 != 1) {
      sVar6 = strlen(local_4a8);
      p_Var8 = local_560;
      if (((2 < sVar6) && (local_4a8[0] == '[')) && (pcVar11[-1] == ']')) {
        pcVar11[-1] = '\0';
        iVar4 = inet_pton(10,local_4a8 + 1,local_328);
        iVar3 = 0;
        if (iVar4 == 1) goto LAB_0010b6ad;
      }
      if (gAllowLiteralHostRedirection == 0) {
        UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x143,
                   "Possible DNS Rebind attack prevented.\n");
        goto LAB_0010b6c7;
      }
      local_54c[1] = 0x1e;
      local_54c[2] = 0x80;
      iVar3 = getsockname(local_530.socket,(sockaddr *)local_3a8,(socklen_t *)(local_54c + 2));
      if (iVar3 == 0) {
        if ((short)local_3a8[0].buf == 10) {
          pcVar7 = inet_ntop(10,&local_3a8[0].length,local_328,0x100);
          if (pcVar7 != (char *)0x0) {
            pcVar7 = "[%s]:%d";
LAB_0010b85e:
            snprintf(local_4a8,0x100,pcVar7,local_328,
                     (ulong)(ushort)(local_3a8[0].buf._2_2_ << 8 | local_3a8[0].buf._2_2_ >> 8));
          }
        }
        else {
          pcVar7 = inet_ntop(2,(void *)((long)&local_3a8[0].buf + 4),local_328,0x100);
          if (pcVar7 != (char *)0x0) {
            pcVar7 = "%s:%d";
            goto LAB_0010b85e;
          }
        }
      }
      membuffer_init(local_3a8);
      snprintf(local_328,0x100,"HTTP/1.1 307 Temporary Redirect\r\nLocation: http://%s\r\n\r\n",
               local_4a8);
      membuffer_append_str(local_3a8,local_328);
      iVar3 = http_SendMessage(&local_530,local_54c + 1,"b",
                               CONCAT44(local_3a8[0].buf._4_4_,
                                        CONCAT22(local_3a8[0].buf._2_2_,(short)local_3a8[0].buf)),
                               local_3a8[0].length);
      membuffer_destroy(local_3a8);
      local_564 = iVar3;
      goto LAB_0010b6c7;
    }
    iVar3 = 0;
    p_Var8 = local_560;
  }
  else {
    iVar3 = (*local_558)(local_4a8,pvVar10);
    p_Var8 = local_560;
    if (iVar3 == -0x77) goto LAB_0010b6c7;
  }
LAB_0010b6ad:
  (*p_Var8)(&local_220,&local_220.msg,&local_530);
  local_564 = iVar3;
LAB_0010b6c7:
  if (0 < local_564) {
    http_SendStatusResponse
              (&local_530,local_564,local_220.msg.major_version,local_220.msg.minor_version);
  }
  sock_destroy(&local_530,2);
  httpmsg_destroy(&local_220.msg);
  free(args);
  UpnpPrintf(UPNP_INFO,MSERV,".upnp/src/genlib/miniserver/miniserver.c",0x1c3,
             "miniserver %d: COMPLETE\n",(ulong)sockfd);
  return;
}

Assistant:

static void handle_request(
	/*! [in] Request Message to be handled. */
	void *args)
{
	SOCKINFO info;
	int http_error_code;
	int ret_code;
	int major = 1;
	int minor = 1;
	http_parser_t parser;
	http_message_t *hmsg = NULL;
	int timeout = HTTP_DEFAULT_TIMEOUT;
	struct mserv_request_t *request = (struct mserv_request_t *)args;
	SOCKET connfd = request->connfd;

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: READING\n",
		connfd);
	/* parser_request_init( &parser ); */ /* LEAK_FIX_MK */
	hmsg = &parser.msg;
	ret_code = sock_init_with_ip(
		&info, connfd, (struct sockaddr *)&request->foreign_sockaddr);
	if (ret_code != UPNP_E_SUCCESS) {
		free(request);
		httpmsg_destroy(hmsg);
		return;
	}
	/* read */
	ret_code = http_RecvMessage(
		&info, &parser, HTTPMETHOD_UNKNOWN, &timeout, &http_error_code);
	if (ret_code != 0) {
		goto error_handler;
	}
	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: PROCESSING...\n",
		connfd);
	/* dispatch */
	http_error_code = dispatch_request(&info, &parser);
	if (http_error_code != 0) {
		goto error_handler;
	}
	http_error_code = 0;

error_handler:
	if (http_error_code > 0) {
		if (hmsg) {
			major = hmsg->major_version;
			minor = hmsg->minor_version;
		}
		handle_error(&info, http_error_code, major, minor);
	}
	sock_destroy(&info, SD_BOTH);
	httpmsg_destroy(hmsg);
	free(request);

	UpnpPrintf(UPNP_INFO,
		MSERV,
		__FILE__,
		__LINE__,
		"miniserver %d: COMPLETE\n",
		connfd);
}